

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O2

ssize_t __thiscall bsplib::Unbuf::send(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000084;
  Entry entry;
  value_type local_20;
  
  local_20.pid = (int)__buf;
  local_20.size = CONCAT44(in_register_00000084,__flags);
  local_20.addr = (char *)__n;
  local_20.tag = __fd;
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::push_back
            (&this->m_sends,&local_20);
  return extraout_RAX;
}

Assistant:

void Unbuf :: send( int recv_tag, int dst_pid, const void * addr, size_t size )
{
    Entry entry = { dst_pid, 
                    static_cast<char *>(const_cast<void*>(addr)),
                    size, 
                    recv_tag };
    m_sends.push_back( entry );
}